

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Network.cpp
# Opt level: O0

MessageAddressed * __thiscall
Network::RecvMsg(MessageAddressed *__return_storage_ptr__,Network *this,network_address_t dst)

{
  bool bVar1;
  pointer pMVar2;
  reference pMVar3;
  runtime_error *this_00;
  const_iterator local_58 [3];
  undefined1 local_39;
  _Self local_38;
  _Self local_30;
  iterator it;
  lock_guard<std::mutex> guard;
  network_address_t dst_local;
  Network *this_local;
  MessageAddressed *msg;
  
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&it,&this->_mutex);
  local_30._M_node =
       (_List_node_base *)
       std::__cxx11::list<MessageAddressed,_std::allocator<MessageAddressed>_>::begin
                 (&this->_messages);
  while( true ) {
    local_38._M_node =
         (_List_node_base *)
         std::__cxx11::list<MessageAddressed,_std::allocator<MessageAddressed>_>::end
                   (&this->_messages);
    bVar1 = std::operator!=(&local_30,&local_38);
    if (!bVar1) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"no message for you");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pMVar2 = std::_List_iterator<MessageAddressed>::operator->(&local_30);
    if (pMVar2->dst == dst) break;
    std::_List_iterator<MessageAddressed>::operator++(&local_30);
  }
  local_39 = 0;
  pMVar3 = std::_List_iterator<MessageAddressed>::operator*(&local_30);
  MessageAddressed::MessageAddressed(__return_storage_ptr__,pMVar3);
  std::_List_const_iterator<MessageAddressed>::_List_const_iterator(local_58,&local_30);
  std::__cxx11::list<MessageAddressed,_std::allocator<MessageAddressed>_>::erase
            (&this->_messages,local_58[0]);
  local_39 = 1;
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&it);
  return __return_storage_ptr__;
}

Assistant:

MessageAddressed Network::RecvMsg(network_address_t dst) {
    std::lock_guard<std::mutex> guard(_mutex);
    for (auto it = _messages.begin(); it !=_messages.end(); ++it)
    {
        if(it->dst == dst)
        {
            auto msg = * it;
            _messages.erase(it);
            return msg;
        }
    }
    throw std::runtime_error("no message for you");
}